

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O2

void __thiscall
detail::vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true>::operator()
          (vector_push_back_pointer_operator_impl<unsigned_int,_char_*,_true> *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *v,
          vector_push_back_helper<char_*> info)

{
  int iVar1;
  undefined8 in_RAX;
  long lVar2;
  uint tmp;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (v,((long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(v->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 2);
  for (lVar2 = 0; lVar2 != 0x40; lVar2 = lVar2 + 0x20) {
    iVar1 = (int)((ulong)info.value >> ((byte)lVar2 & 0x3f));
    uStack_28 = CONCAT44(iVar1,(undefined4)uStack_28);
    if (iVar1 != 0) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (v,(value_type_conflict *)((long)&uStack_28 + 4));
    }
  }
  return;
}

Assistant:

void operator()(std::vector<value_type>& v, vector_push_back_helper<T> info) {
			constexpr size_t size_time = sizeof(T) / sizeof(value_type);
			constexpr size_t rshft_num = sizeof(value_type) * CHAR_BIT;
			v.reserve(v.size() + size_time);
			for (size_t i = 0; i < size_time; ++i) {
				if(auto tmp = static_cast<value_type>(((std::uintmax_t)(info.value)) >> (rshft_num * i))) v.push_back(tmp);
			}
		}